

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::js::api::json::PsbtRecordData::ConvertFromStruct
          (PsbtRecordData *this,PsbtRecordDataStruct *data)

{
  this->index_ = data->index;
  std::__cxx11::string::_M_assign((string *)&this->type_);
  std::__cxx11::string::_M_assign((string *)&this->key_);
  std::__cxx11::string::_M_assign((string *)&this->value_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void PsbtRecordData::ConvertFromStruct(
    const PsbtRecordDataStruct& data) {
  index_ = data.index;
  type_ = data.type;
  key_ = data.key;
  value_ = data.value;
  ignore_items = data.ignore_items;
}